

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemdelegate.cpp
# Opt level: O3

bool __thiscall
QAbstractItemDelegatePrivate::handleEditorEvent
          (QAbstractItemDelegatePrivate *this,QObject *object,QEvent *event)

{
  ushort uVar1;
  QObject *obj;
  char cVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  QWidget *pQVar6;
  QAbstractItemDelegatePrivate *pQVar7;
  long lVar8;
  EndEditHint _t2;
  QEvent *this_00;
  QAbstractItemDelegatePrivate *this_01;
  long in_FS_OFFSET;
  QWidget *editor;
  QObject *local_70;
  undefined4 local_64;
  QObject *local_60;
  QMetaMethodArgument local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((object != (QObject *)0x0) && ((*(byte *)(*(long *)(object + 8) + 0x30) & 1) != 0)) {
    obj = *(QObject **)&this->field_0x8;
    uVar1 = *(ushort *)(event + 8);
    bVar3 = false;
    local_70 = object;
    if (uVar1 < 0x12) {
      if (uVar1 == 6) {
        lVar8 = QMetaObject::cast((QObject *)&QTextEdit::staticMetaObject);
        if ((((lVar8 == 0) &&
             (lVar8 = QMetaObject::cast((QObject *)&QPlainTextEdit::staticMetaObject), lVar8 == 0))
            || (4 < *(int *)(event + 0x40) + 0xfeffffffU)) ||
           ((0x1bU >> (*(int *)(event + 0x40) + 0xfeffffffU & 0x1f) & 1) == 0)) {
          this_00 = event;
          cVar2 = QKeyEvent::matches((StandardKey)event);
          if (cVar2 != '\0') {
            local_58.name = (char *)&local_60;
            local_58.data = &local_64;
            local_64 = 4;
            local_58.metaType = (InterfaceType *)0x0;
            local_60 = object;
            QMetaObject::activate(obj,&QAbstractItemDelegate::staticMetaObject,1,&local_58.metaType)
            ;
LAB_0052d523:
            bVar3 = true;
            goto LAB_0052d41a;
          }
          iVar5 = *(int *)(event + 0x40);
          if (1 < iVar5 + 0xfefffffcU) {
            if (iVar5 == 0x1000002) {
              bVar4 = tryFixup((QAbstractItemDelegatePrivate *)this_00,(QWidget *)object);
              bVar3 = true;
              if (!bVar4) goto LAB_0052d41a;
              local_58.name = (char *)&local_60;
              local_58.metaType = (InterfaceType *)0x0;
              local_60 = object;
              QMetaObject::activate
                        (obj,&QAbstractItemDelegate::staticMetaObject,0,&local_58.metaType);
              _t2 = EditPreviousItem;
            }
            else {
              if (iVar5 != 0x1000001) goto LAB_0052d418;
              bVar4 = tryFixup((QAbstractItemDelegatePrivate *)this_00,(QWidget *)object);
              bVar3 = true;
              if (!bVar4) goto LAB_0052d41a;
              local_58.name = (char *)&local_60;
              local_58.metaType = (InterfaceType *)0x0;
              local_60 = object;
              QMetaObject::activate
                        (obj,&QAbstractItemDelegate::staticMetaObject,0,&local_58.metaType);
              _t2 = EditNextItem;
            }
            QAbstractItemDelegate::closeEditor((QAbstractItemDelegate *)obj,(QWidget *)object,_t2);
            bVar3 = true;
            goto LAB_0052d41a;
          }
          bVar4 = tryFixup((QAbstractItemDelegatePrivate *)this_00,(QWidget *)object);
          bVar3 = true;
          if (!bVar4) goto LAB_0052d41a;
          local_58.metaType = &QtPrivate::QMetaTypeInterfaceWrapper<QWidget_*>::metaType;
          local_58.name = "QWidget*";
          local_58.data = &local_70;
          QMetaObject::invokeMethod<QMetaMethodArgument>
                    (obj,"_q_commitDataAndCloseEditor",QueuedConnection,&local_58);
        }
      }
      else {
        if (uVar1 != 9) goto LAB_0052d41a;
LAB_0052d539:
        bVar3 = QWidget::isActiveWindow((QWidget *)object);
        if ((!bVar3) || (pQVar6 = QApplication::focusWidget(), pQVar6 != (QWidget *)object)) {
          for (pQVar6 = QApplication::focusWidget(); pQVar6 != (QWidget *)0x0;
              pQVar6 = *(QWidget **)(*(long *)&pQVar6->field_0x8 + 0x10)) {
            if (pQVar6 == (QWidget *)object) goto LAB_0052d418;
          }
          this_01 = QGuiApplicationPrivate::platform_integration;
          pQVar7 = (QAbstractItemDelegatePrivate *)
                   (**(code **)(*(long *)QGuiApplicationPrivate::platform_integration + 0x78))();
          if ((pQVar7 == (QAbstractItemDelegatePrivate *)0x0) ||
             (lVar8 = QPlatformDrag::currentDrag(), this_01 = pQVar7, lVar8 == 0)) {
            bVar3 = tryFixup(this_01,(QWidget *)object);
            if (bVar3) {
              local_58.metaType = (InterfaceType *)0x0;
              local_60 = object;
              local_58.name = (char *)&local_60;
              QMetaObject::activate
                        (obj,&QAbstractItemDelegate::staticMetaObject,0,&local_58.metaType);
            }
            if (*(short *)(event + 8) == 9) {
              pQVar6 = *(QWidget **)(*(long *)(object + 8) + 0x10);
              bVar3 = QWidget::hasFocus((QWidget *)object);
              if (pQVar6 != (QWidget *)0x0 && !bVar3) {
                iVar5 = QFocusEvent::reason();
                QAbstractItemDelegate::closeEditor
                          ((QAbstractItemDelegate *)obj,(QWidget *)object,NoHint);
                bVar3 = false;
                if (iVar5 != 3) goto LAB_0052d41a;
                QWidget::setFocus(pQVar6,OtherFocusReason);
                goto LAB_0052d418;
              }
            }
            local_58.data = &local_64;
            local_64 = 0;
            local_58.metaType = (InterfaceType *)0x0;
            local_60 = object;
            local_58.name = (char *)&local_60;
            QMetaObject::activate(obj,&QAbstractItemDelegate::staticMetaObject,1,&local_58.metaType)
            ;
          }
        }
      }
    }
    else if (uVar1 == 0x12) {
      if ((*(byte *)(*(long *)(object + 0x20) + 0xc) & 1) != 0) goto LAB_0052d539;
    }
    else {
      bVar3 = false;
      if (uVar1 != 0x33) goto LAB_0052d41a;
      cVar2 = QKeyEvent::matches((StandardKey)event);
      if (cVar2 != '\0') {
        event[0xc] = (QEvent)0x1;
        goto LAB_0052d523;
      }
    }
  }
LAB_0052d418:
  bVar3 = false;
LAB_0052d41a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool QAbstractItemDelegatePrivate::handleEditorEvent(QObject *object, QEvent *event)
{
    Q_Q(QAbstractItemDelegate);

    QWidget *editor = qobject_cast<QWidget*>(object);
    if (!editor)
        return false;
    if (event->type() == QEvent::KeyPress) {
        QKeyEvent *keyEvent = static_cast<QKeyEvent *>(event);
        if (editorHandlesKeyEvent(editor, keyEvent))
            return false;

#ifndef QT_NO_SHORTCUT
        if (keyEvent->matches(QKeySequence::Cancel)) {
            // don't commit data
            emit q->closeEditor(editor, QAbstractItemDelegate::RevertModelCache);
            return true;
        }
#endif

        switch (keyEvent->key()) {
        case Qt::Key_Tab:
            if (tryFixup(editor)) {
                emit q->commitData(editor);
                emit q->closeEditor(editor, QAbstractItemDelegate::EditNextItem);
            }
            return true;
        case Qt::Key_Backtab:
            if (tryFixup(editor)) {
                emit q->commitData(editor);
                emit q->closeEditor(editor, QAbstractItemDelegate::EditPreviousItem);
            }
            return true;
        case Qt::Key_Enter:
        case Qt::Key_Return:
            // We want the editor to be able to process the key press
            // before committing the data (e.g. so it can do
            // validation/fixup of the input).
            if (!tryFixup(editor))
                return true;

            QMetaObject::invokeMethod(q, "_q_commitDataAndCloseEditor",
                                      Qt::QueuedConnection, Q_ARG(QWidget*, editor));
            return false;
        default:
            return false;
        }
    } else if (event->type() == QEvent::FocusOut || (event->type() == QEvent::Hide && editor->isWindow())) {
        //the Hide event will take care of he editors that are in fact complete dialogs
        if (!editor->isActiveWindow() || (QApplication::focusWidget() != editor)) {
            QWidget *w = QApplication::focusWidget();
            while (w) { // don't worry about focus changes internally in the editor
                if (w == editor)
                    return false;
                w = w->parentWidget();
            }
#if QT_CONFIG(draganddrop)
            // The window may lose focus during an drag operation.
            // i.e when dragging involves the taskbar on Windows.
            QPlatformDrag *platformDrag = QGuiApplicationPrivate::instance()->platformIntegration()->drag();
            if (platformDrag && platformDrag->currentDrag()) {
                return false;
            }
#endif
            if (tryFixup(editor))
                emit q->commitData(editor);

            // If the application loses focus while editing, then the focus needs to go back
            // to the itemview when the editor closes. This ensures that when the application
            // is active again it will have the focus on the itemview as expected.
            QWidget *editorParent = editor->parentWidget();
            const bool manuallyFixFocus = (event->type() == QEvent::FocusOut) && !editor->hasFocus() &&
                    editorParent &&
                    (static_cast<QFocusEvent *>(event)->reason() == Qt::ActiveWindowFocusReason);
            emit q->closeEditor(editor, QAbstractItemDelegate::NoHint);
            if (manuallyFixFocus)
                editorParent->setFocus();
        }
#ifndef QT_NO_SHORTCUT
    } else if (event->type() == QEvent::ShortcutOverride) {
        if (static_cast<QKeyEvent*>(event)->matches(QKeySequence::Cancel)) {
            event->accept();
            return true;
        }
#endif
    }
    return false;
}